

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_portal.cpp
# Opt level: O2

void __thiscall GLEEHorizonPortal::DrawContents(GLEEHorizonPortal *this)

{
  sector_t *sec;
  int iVar1;
  GLSkyInfo skyinfo;
  GLSkyPortal sky;
  
  sec = this->portal->mOrigin;
  if ((sec->planes[0].Texture.texnum == skyflatnum.texnum) ||
     (iVar1 = sec->planes[1].Texture.texnum, iVar1 == skyflatnum.texnum)) {
    GLSkyInfo::init(&skyinfo,(EVP_PKEY_CTX *)(ulong)(uint)sec->sky);
    GLSkyPortal::GLSkyPortal(&sky,&skyinfo,true);
    GLSkyPortal::DrawContents(&sky);
    GLPortal::~GLPortal(&sky.super_GLPortal);
    iVar1 = sec->planes[1].Texture.texnum;
  }
  if (iVar1 != skyflatnum.texnum) {
    GLSectorPlane::GetFromSector((GLSectorPlane *)&skyinfo,sec,1);
    sector_t::GetCeilingLight(sec);
    GLHorizonPortal::GLHorizonPortal((GLHorizonPortal *)&sky,(GLHorizonInfo *)&skyinfo,true);
    GLHorizonPortal::DrawContents((GLHorizonPortal *)&sky);
    GLPortal::~GLPortal(&sky.super_GLPortal);
  }
  if (sec->planes[0].Texture.texnum != skyflatnum.texnum) {
    GLSectorPlane::GetFromSector((GLSectorPlane *)&skyinfo,sec,0);
    sector_t::GetFloorLight(sec);
    GLHorizonPortal::GLHorizonPortal((GLHorizonPortal *)&sky,(GLHorizonInfo *)&skyinfo,true);
    GLHorizonPortal::DrawContents((GLHorizonPortal *)&sky);
    GLPortal::~GLPortal(&sky.super_GLPortal);
  }
  return;
}

Assistant:

void GLEEHorizonPortal::DrawContents()
{
	PortalAll.Clock();
	sector_t *sector = portal->mOrigin;
	if (sector->GetTexture(sector_t::floor) == skyflatnum ||
		sector->GetTexture(sector_t::ceiling) == skyflatnum)
	{
		GLSkyInfo skyinfo;
		skyinfo.init(sector->sky, 0);
		GLSkyPortal sky(&skyinfo, true);
		sky.DrawContents();
	}
	if (sector->GetTexture(sector_t::ceiling) != skyflatnum)
	{
		GLHorizonInfo horz;
		horz.plane.GetFromSector(sector, true);
		horz.lightlevel = gl_ClampLight(sector->GetCeilingLight());
		horz.colormap = sector->ColorMap;
		if (portal->mType == PORTS_PLANE)
		{
			horz.plane.Texheight = ViewPos.Z + fabs(horz.plane.Texheight);
		}
		GLHorizonPortal ceil(&horz, true);
		ceil.DrawContents();
	}
	if (sector->GetTexture(sector_t::floor) != skyflatnum)
	{
		GLHorizonInfo horz;
		horz.plane.GetFromSector(sector, false);
		horz.lightlevel = gl_ClampLight(sector->GetFloorLight());
		horz.colormap = sector->ColorMap;
		if (portal->mType == PORTS_PLANE)
		{
			horz.plane.Texheight = ViewPos.Z - fabs(horz.plane.Texheight);
		}
		GLHorizonPortal floor(&horz, true);
		floor.DrawContents();
	}



}